

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void __thiscall
Vault::HttpClient::HttpClient
          (HttpClient *this,Config *config,HttpErrorCallback *errorCallback,
          ResponseErrorCallback *responseErrorCallback)

{
  this->_vptr_HttpClient = (_func_int **)&PTR__HttpClient_001c5aa8;
  Config::Config(&this->config_,config);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&this->errorCallback_,errorCallback);
  std::function<void_(const_Vault::HttpResponse_&)>::function
            (&this->responseErrorCallback_,responseErrorCallback);
  return;
}

Assistant:

Vault::HttpClient::HttpClient(Vault::Config config,
                              HttpErrorCallback errorCallback,
                              ResponseErrorCallback responseErrorCallback)
    : config_(std::move(config)), errorCallback_(std::move(errorCallback)),
      responseErrorCallback_(std::move(responseErrorCallback)) {}